

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

roaring64_bitmap_t * roaring64_bitmap_create(void)

{
  roaring64_bitmap_t *prVar1;
  roaring64_bitmap_t *r;
  
  prVar1 = (roaring64_bitmap_t *)roaring_malloc(0x11c1cb);
  art_init_cleared(&r->art);
  prVar1->flags = '\0';
  prVar1->capacity = 0;
  prVar1->first_free = 0;
  prVar1->containers = (container_t **)0x0;
  return prVar1;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_create(void) {
    roaring64_bitmap_t *r =
        (roaring64_bitmap_t *)roaring_malloc(sizeof(roaring64_bitmap_t));
    art_init_cleared(&r->art);
    r->flags = 0;
    r->capacity = 0;
    r->first_free = 0;
    r->containers = NULL;
    return r;
}